

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridAxisRegular::Decode(GridAxisRegular *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GridAxisRegular *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x18) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,(double *)&this->m_f64DomainInitialXi);
  pKVar2 = KDataStream::operator>>(pKVar2,(double *)&this->m_f64DomainFinalXi);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16DomainPointsXi);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8InterleafFactor);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8AxisType);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16NumPoints);
  KDataStream::operator>>(pKVar2,&this->m_ui16InitialIndex);
  return;
}

Assistant:

void GridAxisRegular::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_AXIS_REGULAR )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f64DomainInitialXi
           >> m_f64DomainFinalXi
           >> m_ui16DomainPointsXi
           >> m_ui8InterleafFactor
           >> m_ui8AxisType
           >> m_ui16NumPoints
           >> m_ui16InitialIndex;
}